

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall Am_Object_Advanced::Invoke_Demons(Am_Object_Advanced *this,bool active)

{
  Am_Object_Data *pAVar1;
  
  pAVar1 = (this->super_Am_Object).data;
  if (pAVar1 != (Am_Object_Data *)0x0) {
    pAVar1->demons_active = (ushort)active << 0xf | pAVar1->demons_active & 0x7fff;
    return;
  }
  Am_Error("** Invoke_Demons called on a (0L) object.");
}

Assistant:

void
Am_Object_Advanced::Invoke_Demons(bool active)
{
  if (!data)
    Am_Error("** Invoke_Demons called on a (0L) object.");
  if (active)
    data->demons_active |= DEMONS_ACTIVE;
  else
    data->demons_active &= ~DEMONS_ACTIVE;
}